

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O0

void __thiscall
xemmai::t_slot_of<xemmai::t_type_of<xemmai::t_object>_>::f_construct
          (t_slot_of<xemmai::t_type_of<xemmai::t_object>_> *this,t_object *a_value)

{
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  t_type_of<xemmai::t_object> *ptVar1;
  undefined8 *puVar2;
  __pointer_type ptVar3;
  t_object *a_value_local;
  t_slot_of<xemmai::t_type_of<xemmai::t_object>_> *this_local;
  __pointer_type p;
  
  ptVar1 = t_object::f_as<xemmai::t_type_of<xemmai::t_object>>(a_value);
  this->v_p = ptVar1;
  if ((t_object *)0x4 < a_value) {
    puVar2 = (undefined8 *)__tls_get_addr(&PTR_00163c50);
    this_00 = (t_queue<128UL> *)*puVar2;
    *this_00->v_head = a_value;
    if (this_00->v_head == this_00->v_next) {
      t_slot::t_queue<128UL>::f_next(this_00);
    }
    else {
      this_00->v_head = this_00->v_head + 1;
    }
  }
  ptVar3 = std::atomic<xemmai::t_object_*>::exchange(&(this->v_slot).v_p,a_value,relaxed);
  if ((__pointer_type)0x4 < ptVar3) {
    puVar2 = (undefined8 *)__tls_get_addr(&PTR_00163ca8);
    this_01 = (t_queue<256UL> *)*puVar2;
    *this_01->v_head = ptVar3;
    if (this_01->v_head == this_01->v_next) {
      t_slot::t_queue<256UL>::f_next(this_01);
    }
    else {
      this_01->v_head = this_01->v_head + 1;
    }
  }
  return;
}

Assistant:

inline void t_slot_of<T>::f_construct(t_object* a_value)
{
	v_p = &a_value->f_as<T>();
	v_slot = a_value;
}